

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImGui::GetKeyPressedAmount(ImGuiKey key,float repeat_delay,float repeat_rate)

{
  ImGuiContext *pIVar1;
  int iVar2;
  ImGuiKeyData *pIVar3;
  
  pIVar1 = GImGui;
  pIVar3 = GetKeyData(key);
  iVar2 = CalcTypematicRepeatAmount
                    (pIVar3->DownDuration - (pIVar1->IO).DeltaTime,pIVar3->DownDuration,repeat_delay
                     ,repeat_rate);
  return iVar2;
}

Assistant:

int ImGui::GetKeyPressedAmount(ImGuiKey key, float repeat_delay, float repeat_rate)
{
    ImGuiContext& g = *GImGui;
    const ImGuiKeyData* key_data = GetKeyData(key);
    const float t = key_data->DownDuration;
    return CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, repeat_delay, repeat_rate);
}